

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution_x86::forward
          (Convolution_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  _func_int **pp_Var1;
  Layer *pLVar2;
  ParamDictPrivate **ppPVar3;
  undefined8 in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  Mat weights [2];
  ParamDict pd;
  Layer *op;
  Mat *_bias_data;
  Mat bias_data_flattened;
  Mat weight_data_flattened;
  int _num_output;
  int _kernel_h;
  int _kernel_w;
  Mat *top_blob;
  Mat *_weight_data;
  Mat *bottom_blob;
  ParamDict *in_stack_fffffffffffffbc0;
  Mat *in_stack_fffffffffffffbc8;
  ParamDict *pPVar4;
  int in_stack_fffffffffffffbd4;
  Mat *in_stack_fffffffffffffbd8;
  void **ppvVar5;
  ParamDict *in_stack_fffffffffffffbe0;
  Option *in_stack_fffffffffffffbf0;
  Mat *in_stack_fffffffffffffbf8;
  Mat *in_stack_fffffffffffffc00;
  ParamDict *local_3e8;
  ParamDict *local_398;
  undefined1 local_338 [16];
  ParamDict local_328;
  _func_int **local_318;
  undefined4 local_310;
  _func_int **local_308;
  undefined4 local_300;
  undefined4 local_2fc;
  undefined4 local_2f8;
  undefined4 local_2f4;
  undefined4 local_2f0;
  _func_int **local_2e8;
  void *local_2e0;
  int *local_2d8;
  void *local_2d0;
  undefined4 local_2c8;
  long *local_2c0;
  undefined4 local_2b8;
  undefined4 local_2b4;
  undefined4 local_2b0;
  undefined4 local_2ac;
  undefined4 local_2a8;
  void *local_2a0;
  ParamDict local_298;
  Layer *local_288;
  const_reference local_280;
  void *local_278;
  int *local_270;
  ulong local_268;
  int local_260;
  long *local_258;
  undefined4 local_250;
  int local_24c;
  undefined4 local_248;
  undefined4 local_244;
  int local_240;
  long local_238;
  undefined4 local_230;
  ParamDict local_220;
  ulong local_210;
  int local_208;
  long *local_200;
  undefined4 local_1f8;
  int local_1f4;
  undefined4 local_1f0;
  undefined4 local_1ec;
  int local_1e8;
  long local_1e0;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  reference local_1c8;
  const_reference local_1c0;
  const_reference local_1b8;
  undefined8 local_1b0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1a8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_1a0;
  int local_18c;
  ParamDict *local_188;
  void **local_180;
  ParamDict *local_178;
  ParamDictPrivate **local_168;
  void **local_158;
  ParamDict *local_148;
  int local_138;
  undefined4 local_134;
  void **local_130;
  void **local_128;
  void **local_120;
  int local_118;
  undefined4 local_114;
  ParamDict *local_110;
  ParamDict *local_108;
  ParamDict *local_100;
  int local_f8;
  undefined4 local_f4;
  ParamDict *local_f0;
  int local_e8;
  undefined4 local_e4;
  void **local_e0;
  int local_c8;
  undefined4 local_c4;
  ParamDict *local_c0;
  int local_a8;
  undefined4 local_a4;
  void **local_a0;
  int local_88;
  undefined4 local_84;
  ParamDictPrivate **local_80;
  void **local_68;
  ParamDict *local_60;
  ParamDictPrivate *local_50;
  void *local_40;
  _func_int **local_30;
  ParamDict *local_10;
  void **local_8;
  
  local_1b0 = in_RCX;
  local_1a8 = in_RDX;
  local_1a0 = in_RSI;
  local_1b8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_1c0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1a0,1);
  local_1c8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1a8,0);
  local_1cc = local_1c0->w;
  local_1d0 = local_1c0->h;
  local_1d4 = local_1c0->c * local_1c0->elempack;
  local_188 = &local_220;
  local_220._vptr_ParamDict = (_func_int **)0x0;
  local_220.d = (ParamDictPrivate *)0x0;
  local_210 = 0;
  local_208 = 0;
  local_200 = (long *)0x0;
  local_1f8 = 0;
  local_1f4 = 0;
  local_1f0 = 0;
  local_1ec = 0;
  local_1e8 = 0;
  local_1e0 = 0;
  flatten(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  local_60 = &local_220;
  if (local_220._vptr_ParamDict != (_func_int **)0x0) {
    local_10 = local_60;
  }
  if (local_220._vptr_ParamDict == (_func_int **)0x0 || local_1e0 * local_1e8 == 0) {
    local_18c = -100;
    local_230 = 1;
    goto LAB_002a1090;
  }
  local_1f4 = local_208 * local_1f4;
  local_210 = local_210 / (ulong)(long)local_208;
  local_208 = 1;
  local_180 = &local_278;
  local_278 = (void *)0x0;
  local_270 = (int *)0x0;
  local_268 = 0;
  local_260 = 0;
  local_258 = (long *)0x0;
  local_250 = 0;
  local_24c = 0;
  local_248 = 0;
  local_244 = 0;
  local_240 = 0;
  local_238 = 0;
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100) == 0) {
LAB_002a0266:
    local_288 = create_layer((int)((ulong)in_stack_fffffffffffffbc8 >> 0x20));
    ParamDict::ParamDict(in_stack_fffffffffffffbe0);
    ParamDict::set(&local_298,0,local_1d4);
    ParamDict::set(&local_298,1,local_1cc);
    ParamDict::set(&local_298,0xb,local_1d0);
    ParamDict::set(&local_298,2,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc));
    ParamDict::set(&local_298,0x15,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0));
    ParamDict::set(&local_298,3,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4));
    ParamDict::set(&local_298,0x1f,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8));
    ParamDict::set(&local_298,4,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec));
    ParamDict::set(&local_298,0xf,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0));
    ParamDict::set(&local_298,0xe,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf4));
    ParamDict::set(&local_298,0x10,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8));
    ParamDict::set(&local_298,0x12,*(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xfc));
    ParamDict::set(&local_298,5,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100));
    ParamDict::set(&local_298,6,local_1f4);
    ParamDict::set(&local_298,8,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108));
    ParamDict::set(&local_298,9,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x10c));
    ParamDict::set((ParamDict *)in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
                   in_stack_fffffffffffffbc8);
    (*local_288->_vptr_Layer[2])(local_288,&local_298);
    local_398 = &local_328;
    do {
      local_178 = local_398;
      local_398->_vptr_ParamDict = (_func_int **)0x0;
      local_398->d = (ParamDictPrivate *)0x0;
      local_398[1]._vptr_ParamDict = (_func_int **)0x0;
      *(undefined4 *)&local_398[1].d = 0;
      local_398[2]._vptr_ParamDict = (_func_int **)0x0;
      *(undefined4 *)&local_398[2].d = 0;
      *(undefined4 *)((long)&local_398[2].d + 4) = 0;
      *(undefined4 *)&local_398[3]._vptr_ParamDict = 0;
      *(undefined4 *)((long)&local_398[3]._vptr_ParamDict + 4) = 0;
      *(undefined4 *)&local_398[3].d = 0;
      local_398[4]._vptr_ParamDict = (_func_int **)0x0;
      local_398 = (ParamDict *)&local_398[4].d;
    } while (local_398 != &local_298);
    local_110 = &local_220;
    local_108 = &local_328;
    if (&local_328 != local_110) {
      if (local_220.d != (ParamDictPrivate *)0x0) {
        local_114 = 1;
        LOCK();
        local_118 = (local_220.d)->params[0].type;
        (local_220.d)->params[0].type = (local_220.d)->params[0].type + 1;
        UNLOCK();
      }
      local_f0 = &local_328;
      if (local_328.d != (ParamDictPrivate *)0x0) {
        local_f4 = 0xffffffff;
        LOCK();
        local_f8 = (local_328.d)->params[0].type;
        (local_328.d)->params[0].type = (local_328.d)->params[0].type + -1;
        UNLOCK();
        if (local_f8 == 1) {
          if (local_308 == (_func_int **)0x0) {
            if (local_328._vptr_ParamDict != (_func_int **)0x0) {
              free(local_328._vptr_ParamDict);
            }
          }
          else {
            (**(code **)(*local_308 + 0x18))(local_308,local_328._vptr_ParamDict);
          }
        }
      }
      local_328._vptr_ParamDict = local_110->_vptr_ParamDict;
      local_328.d = local_110->d;
      local_318 = local_110[1]._vptr_ParamDict;
      local_310 = *(undefined4 *)&local_110[1].d;
      local_308 = local_110[2]._vptr_ParamDict;
      local_300 = *(undefined4 *)&local_110[2].d;
      local_2fc = *(undefined4 *)((long)&local_110[2].d + 4);
      local_2f8 = *(undefined4 *)&local_110[3]._vptr_ParamDict;
      local_2f4 = *(undefined4 *)((long)&local_110[3]._vptr_ParamDict + 4);
      local_2f0 = *(undefined4 *)&local_110[3].d;
      local_2e8 = local_110[4]._vptr_ParamDict;
    }
    local_130 = &local_278;
    local_128 = &local_2e0;
    local_100 = &local_328;
    if (&local_2e0 != local_130) {
      if (local_270 != (int *)0x0) {
        local_134 = 1;
        LOCK();
        local_138 = *local_270;
        *local_270 = *local_270 + 1;
        UNLOCK();
      }
      local_e0 = &local_2e0;
      if (local_2d8 != (int *)0x0) {
        local_e4 = 0xffffffff;
        LOCK();
        local_e8 = *local_2d8;
        *local_2d8 = *local_2d8 + -1;
        UNLOCK();
        if (local_e8 == 1) {
          if (local_2c0 == (long *)0x0) {
            if (local_2e0 != (void *)0x0) {
              free(local_2e0);
            }
          }
          else {
            (**(code **)(*local_2c0 + 0x18))(local_2c0,local_2e0);
          }
        }
      }
      local_2e0 = *local_130;
      local_2d8 = (int *)local_130[1];
      local_2d0 = local_130[2];
      local_2c8 = *(undefined4 *)(local_130 + 3);
      local_2c0 = (long *)local_130[4];
      local_2b8 = *(undefined4 *)(local_130 + 5);
      local_2b4 = *(undefined4 *)((long)local_130 + 0x2c);
      local_2b0 = *(undefined4 *)(local_130 + 6);
      local_2ac = *(undefined4 *)((long)local_130 + 0x34);
      local_2a8 = *(undefined4 *)(local_130 + 7);
      local_2a0 = local_130[8];
    }
    pLVar2 = local_288;
    local_120 = &local_2e0;
    ModelBinFromMatArray::ModelBinFromMatArray
              ((ModelBinFromMatArray *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
    (*pLVar2->_vptr_Layer[3])(pLVar2,local_338);
    ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffffbc0);
    (*local_288->_vptr_Layer[4])(local_288,local_1b0);
    (*local_288->_vptr_Layer[7])(local_288,local_1b8,local_1c8,local_1b0);
    (*local_288->_vptr_Layer[5])(local_288,local_1b0);
    if (local_288 != (Layer *)0x0) {
      (*local_288->_vptr_Layer[1])();
    }
    local_18c = 0;
    local_230 = 1;
    local_3e8 = &local_298;
    do {
      ppPVar3 = &local_3e8[-5].d;
      pPVar4 = (ParamDict *)ppPVar3;
      local_168 = ppPVar3;
      local_80 = ppPVar3;
      if (local_3e8[-4]._vptr_ParamDict != (_func_int **)0x0) {
        pp_Var1 = local_3e8[-4]._vptr_ParamDict;
        local_84 = 0xffffffff;
        LOCK();
        local_88 = *(int *)pp_Var1;
        *(int *)pp_Var1 = *(int *)pp_Var1 + -1;
        UNLOCK();
        if (local_88 == 1) {
          if (local_3e8[-3].d == (ParamDictPrivate *)0x0) {
            local_50 = *ppPVar3;
            if (local_50 != (ParamDictPrivate *)0x0) {
              free(local_50);
            }
          }
          else {
            (**(code **)(*(long *)(local_3e8[-3].d)->params + 0x18))(local_3e8[-3].d,*ppPVar3);
          }
        }
      }
      *ppPVar3 = (ParamDictPrivate *)0x0;
      local_3e8[-4].d = (ParamDictPrivate *)0x0;
      *(undefined4 *)&local_3e8[-3]._vptr_ParamDict = 0;
      *(undefined4 *)&local_3e8[-2]._vptr_ParamDict = 0;
      *(undefined4 *)((long)&local_3e8[-2]._vptr_ParamDict + 4) = 0;
      *(undefined4 *)&local_3e8[-2].d = 0;
      *(undefined4 *)((long)&local_3e8[-2].d + 4) = 0;
      *(undefined4 *)&local_3e8[-1]._vptr_ParamDict = 0;
      local_3e8[-1].d = (ParamDictPrivate *)0x0;
      local_3e8[-4]._vptr_ParamDict = (_func_int **)0x0;
      local_3e8 = pPVar4;
    } while (pPVar4 != &local_328);
    ParamDict::~ParamDict(in_stack_fffffffffffffbc0);
  }
  else {
    local_280 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_1a0,2);
    flatten(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    local_68 = &local_278;
    if (local_278 != (void *)0x0) {
      local_8 = local_68;
    }
    if (local_278 != (void *)0x0 && local_238 * local_240 != 0) {
      local_24c = local_260 * local_24c;
      local_268 = local_268 / (ulong)(long)local_260;
      local_260 = 1;
      goto LAB_002a0266;
    }
    local_18c = -100;
    local_230 = 1;
  }
  ppvVar5 = &local_278;
  local_158 = ppvVar5;
  local_a0 = ppvVar5;
  if (local_270 != (int *)0x0) {
    local_a4 = 0xffffffff;
    LOCK();
    local_a8 = *local_270;
    *local_270 = *local_270 + -1;
    UNLOCK();
    if (local_a8 == 1) {
      if (local_258 == (long *)0x0) {
        local_40 = local_278;
        if (local_278 != (void *)0x0) {
          free(local_278);
        }
      }
      else {
        (**(code **)(*local_258 + 0x18))(local_258,local_278);
      }
    }
  }
  *ppvVar5 = (void *)0x0;
  ppvVar5[2] = (void *)0x0;
  *(undefined4 *)(ppvVar5 + 3) = 0;
  *(undefined4 *)(ppvVar5 + 5) = 0;
  *(undefined4 *)((long)ppvVar5 + 0x2c) = 0;
  *(undefined4 *)(ppvVar5 + 6) = 0;
  *(undefined4 *)((long)ppvVar5 + 0x34) = 0;
  *(undefined4 *)(ppvVar5 + 7) = 0;
  ppvVar5[8] = (void *)0x0;
  ppvVar5[1] = (void *)0x0;
LAB_002a1090:
  pPVar4 = &local_220;
  if (local_220.d != (ParamDictPrivate *)0x0) {
    local_c4 = 0xffffffff;
    LOCK();
    local_c8 = (local_220.d)->params[0].type;
    (local_220.d)->params[0].type = (local_220.d)->params[0].type + -1;
    UNLOCK();
    if (local_c8 == 1) {
      local_148 = pPVar4;
      local_c0 = pPVar4;
      if (local_200 == (long *)0x0) {
        local_30 = local_220._vptr_ParamDict;
        if (local_220._vptr_ParamDict != (_func_int **)0x0) {
          free(local_220._vptr_ParamDict);
        }
      }
      else {
        (**(code **)(*local_200 + 0x18))(local_200,local_220._vptr_ParamDict);
      }
    }
  }
  pPVar4->_vptr_ParamDict = (_func_int **)0x0;
  pPVar4[1]._vptr_ParamDict = (_func_int **)0x0;
  *(undefined4 *)&pPVar4[1].d = 0;
  *(undefined4 *)&pPVar4[2].d = 0;
  *(undefined4 *)((long)&pPVar4[2].d + 4) = 0;
  *(undefined4 *)&pPVar4[3]._vptr_ParamDict = 0;
  *(undefined4 *)((long)&pPVar4[3]._vptr_ParamDict + 4) = 0;
  *(undefined4 *)&pPVar4[3].d = 0;
  pPVar4[4]._vptr_ParamDict = (_func_int **)0x0;
  pPVar4->d = (ParamDictPrivate *)0x0;
  return local_18c;
}

Assistant:

int Convolution_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _kernel_w = _weight_data.w;
    const int _kernel_h = _weight_data.h;
    const int _num_output = _weight_data.c * _weight_data.elempack;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    // weight_data_flattened as pack1
    weight_data_flattened.w *= weight_data_flattened.elempack;
    weight_data_flattened.elemsize /= weight_data_flattened.elempack;
    weight_data_flattened.elempack = 1;

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;

        // bias_data_flattened as pack1
        bias_data_flattened.w *= bias_data_flattened.elempack;
        bias_data_flattened.elemsize /= bias_data_flattened.elempack;
        bias_data_flattened.elempack = 1;
    }

    ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Convolution);

    ncnn::ParamDict pd;
    pd.set(0, _num_output);
    pd.set(1, _kernel_w);
    pd.set(11, _kernel_h);
    pd.set(2, dilation_w);
    pd.set(21, dilation_h);
    pd.set(3, stride_w);
    pd.set(31, stride_h);
    pd.set(4, pad_left);
    pd.set(15, pad_right);
    pd.set(14, pad_top);
    pd.set(16, pad_bottom);
    pd.set(18, pad_value);
    pd.set(5, bias_term);
    pd.set(6, weight_data_flattened.w);
    pd.set(8, int8_scale_term);
    pd.set(9, activation_type);
    pd.set(10, activation_params);

    op->load_param(pd);

    ncnn::Mat weights[2];
    weights[0] = weight_data_flattened;
    weights[1] = bias_data_flattened;

    op->load_model(ncnn::ModelBinFromMatArray(weights));

    op->create_pipeline(opt);

    op->forward(bottom_blob, top_blob, opt);

    op->destroy_pipeline(opt);

    delete op;

    return 0;
}